

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall
QFontDialogPrivate::helperPrepareShow(QFontDialogPrivate *this,QPlatformDialogHelper *param_1)

{
  QFontDialogOptions *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->options).value.ptr;
  QWidget::windowTitle
            ((QString *)&local_30,
             *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8);
  QFontDialogOptions::setWindowTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::helperPrepareShow(QPlatformDialogHelper *)
{
    options->setWindowTitle(q_func()->windowTitle());
}